

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::SetUnreachableState(WasmBytecodeGenerator *this,bool isUnreachable)

{
  Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EmitInfo *pEVar4;
  undefined7 in_register_00000031;
  int iVar5;
  EmitInfo local_38;
  EmitInfo info;
  
  this->m_writer =
       (IWasmByteCodeWriter *)(this->mTypedRegisterAllocator).mTypeSpaces[(ulong)!isUnreachable - 4]
  ;
  if ((int)CONCAT71(in_register_00000031,isUnreachable) != 0) {
    if ((this->m_evalStack).list.
        super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x85a,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this_00 = &this->m_evalStack;
    iVar5 = 0;
    while( true ) {
      pEVar4 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Top
                         (this_00);
      if (pEVar4->type == Limit) break;
      local_38 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                           (this_00);
      ReleaseLocation(this,&local_38);
      iVar5 = iVar5 + -1;
    }
    for (; iVar5 != 0; iVar5 = iVar5 + 1) {
      local_38.super_EmitInfoBase.location = 0xffffffff;
      local_38.type = Any;
      JsUtil::
      List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      Add(&this_00->list,&local_38);
    }
  }
  this->isUnreachable = isUnreachable;
  return;
}

Assistant:

void WasmBytecodeGenerator::SetUnreachableState(bool isUnreachable)
{
    m_writer = isUnreachable ? m_emptyWriter : m_originalWriter;
    if (isUnreachable)
    {
        // Replace the current stack with the any type
        Assert(!m_evalStack.Empty());
        uint32 popped = 0;
        while (m_evalStack.Top().type != WasmTypes::Limit)
        {
            EmitInfo info = m_evalStack.Pop();
            ReleaseLocation(&info);
            ++popped;
        }
        while (popped-- > 0)
        {
            m_evalStack.Push(EmitInfo(WasmTypes::Any));
        }
    }
    this->isUnreachable = isUnreachable;
}